

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
__thiscall
benchmark::internal::anon_unknown_7::CreateReporter
          (anon_unknown_7 *this,string *name,OutputOptions allow_color)

{
  bool bVar1;
  ConsoleReporter *this_00;
  ostream *poVar2;
  
  bVar1 = std::operator==(name,"console");
  if (bVar1) {
    this_00 = (ConsoleReporter *)operator_new(0x28);
    ConsoleReporter::ConsoleReporter(this_00,allow_color);
  }
  else {
    bVar1 = std::operator==(name,"json");
    if (bVar1) {
      this_00 = (ConsoleReporter *)operator_new(0x20);
      JSONReporter::JSONReporter((JSONReporter *)this_00);
    }
    else {
      bVar1 = std::operator==(name,"csv");
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Unexpected format: \'");
        poVar2 = std::operator<<(poVar2,(string *)name);
        std::operator<<(poVar2,"\'\n");
        exit(1);
      }
      this_00 = (ConsoleReporter *)operator_new(0x18);
      CSVReporter::CSVReporter((CSVReporter *)this_00);
    }
  }
  *(ConsoleReporter **)this = this_00;
  return (__uniq_ptr_data<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>,_true,_true>
          )(__uniq_ptr_data<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<BenchmarkReporter>
CreateReporter(std::string const& name, ConsoleReporter::OutputOptions allow_color) {
  typedef std::unique_ptr<BenchmarkReporter> PtrType;
  if (name == "console") {
    return PtrType(new ConsoleReporter(allow_color));
  } else if (name == "json") {
    return PtrType(new JSONReporter);
  } else if (name == "csv") {
    return PtrType(new CSVReporter);
  } else {
    std::cerr << "Unexpected format: '" << name << "'\n";
    std::exit(1);
  }
}